

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O3

effect * object_effect(object *obj)

{
  effect **ppeVar1;
  
  ppeVar1 = &obj->effect;
  if (obj->activation != (activation *)0x0) {
    ppeVar1 = &obj->activation->effect;
  }
  return *ppeVar1;
}

Assistant:

struct effect *object_effect(const struct object *obj)
{
	if (obj->activation)
		return obj->activation->effect;
	else if (obj->effect)
		return obj->effect;
	else
		return NULL;
}